

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O2

int jpc_poc_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  int iVar1;
  int iVar2;
  jpc_pocpchg_t *pjVar3;
  
  pjVar3 = (ms->parms).poc.pchgs;
  iVar2 = 0;
  while( true ) {
    if ((ms->parms).soc <= iVar2) {
      return 0;
    }
    iVar1 = jpc_putuint8(out,pjVar3->rlvlnostart);
    if (iVar1 != 0) {
      return -1;
    }
    if (cstate->numcomps < 0x101) {
      iVar1 = jpc_putuint8(out,(uint_fast8_t)pjVar3->compnostart);
    }
    else {
      iVar1 = jpc_putuint16(out,pjVar3->compnostart);
    }
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = jpc_putuint16(out,pjVar3->lyrnoend);
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = jpc_putuint8(out,pjVar3->rlvlnoend);
    if (iVar1 != 0) break;
    if (cstate->numcomps < 0x101) {
      iVar1 = jpc_putuint8(out,(uint_fast8_t)pjVar3->compnoend);
    }
    else {
      iVar1 = jpc_putuint16(out,pjVar3->compnoend);
    }
    if (iVar1 != 0) {
      return -1;
    }
    iVar1 = jpc_putuint8(out,pjVar3->prgord);
    if (iVar1 != 0) {
      return -1;
    }
    iVar2 = iVar2 + 1;
    pjVar3 = pjVar3 + 1;
  }
  return -1;
}

Assistant:

static int jpc_poc_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_poc_t *poc = &ms->parms.poc;
	jpc_pocpchg_t *pchg;
	int pchgno;
	for (pchgno = 0, pchg = poc->pchgs; pchgno < poc->numpchgs; ++pchgno,
	  ++pchg) {
		if (jpc_putuint8(out, pchg->rlvlnostart) ||
		  ((cstate->numcomps > 256) ?
		  jpc_putuint16(out, pchg->compnostart) :
		  jpc_putuint8(out, pchg->compnostart)) ||
		  jpc_putuint16(out, pchg->lyrnoend) ||
		  jpc_putuint8(out, pchg->rlvlnoend) ||
		  ((cstate->numcomps > 256) ?
		  jpc_putuint16(out, pchg->compnoend) :
		  jpc_putuint8(out, pchg->compnoend)) ||
		  jpc_putuint8(out, pchg->prgord)) {
			return -1;
		}
	}
	return 0;
}